

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

void asmjit::v1_14::JitAllocatorImpl_fillPattern(void *mem,uint32_t pattern,size_t byteSize)

{
  size_t i;
  ulong uVar1;
  
  if (byteSize != 0 && ((ulong)mem & 1) != 0) {
    *(char *)mem = (char)pattern;
    mem = (void *)((long)mem + 1);
    byteSize = byteSize - 1;
  }
  if (1 < byteSize && ((ulong)mem & 2) != 0) {
    *(short *)mem = (short)pattern;
    mem = (void *)((long)mem + 2);
    byteSize = byteSize - 2;
  }
  if ((byteSize & 3) == 0) {
    for (uVar1 = 0; byteSize >> 2 != uVar1; uVar1 = uVar1 + 1) {
      *(uint32_t *)((long)mem + uVar1 * 2 * 2) = pattern;
    }
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/jitallocator.cpp"
             ,0x230,"(byteSize & 0x3u) == 0u");
}

Assistant:

ASMJIT_NOINLINE
ASMJIT_FAVOR_SPEED static void JitAllocatorImpl_fillPattern(void* mem, uint32_t pattern, size_t byteSize) noexcept {
  // NOTE: This is always used to fill a pattern in allocated / freed memory. The allocation has always
  // a granularity that is greater than the pattern, however, when shrink() is used, we may end up having
  // an unaligned start, so deal with it here and then copy aligned pattern in the loop.
  if ((uintptr_t(mem) & 0x1u) && byteSize >= 1u) {
    static_cast<uint8_t*>(mem)[0] = uint8_t(pattern & 0xFF);
    mem = static_cast<uint8_t*>(mem) + 1;
    byteSize--;
  }

  if ((uintptr_t(mem) & 0x2u) && byteSize >= 2u) {
    static_cast<uint16_t*>(mem)[0] = uint16_t(pattern & 0xFFFF);
    mem = static_cast<uint16_t*>(mem) + 1;
    byteSize -= 2;
  }

  // Something would be seriously broken if we end up with aligned `mem`, but unaligned `byteSize`.
  ASMJIT_ASSERT((byteSize & 0x3u) == 0u);

  uint32_t* mem32 = static_cast<uint32_t*>(mem);
  size_t n = byteSize / 4u;

  for (size_t i = 0; i < n; i++)
    mem32[i] = pattern;
}